

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O1

bool __thiscall HawkTracer::parser::ProtocolReader::start(ProtocolReader *this)

{
  int iVar1;
  pointer *__ptr;
  long *local_28;
  thread local_20;
  
  iVar1 = (*((this->_stream)._M_t.
             super___uniq_ptr_impl<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
             ._M_t.
             super__Tuple_impl<0UL,_HawkTracer::parser::Stream_*,_std::default_delete<HawkTracer::parser::Stream>_>
             .super__Head_base<0UL,_HawkTracer::parser::Stream_*,_false>._M_head_impl)->_vptr_Stream
            [4])();
  if (SUB41(iVar1,0) != false) {
    LOCK();
    (this->_is_running)._M_base._M_i = true;
    UNLOCK();
    local_20._M_id._M_thread = (id)0;
    local_28 = (long *)operator_new(0x10);
    *local_28 = (long)&PTR___State_00116d18;
    local_28[1] = (long)this;
    std::thread::_M_start_thread(&local_20,&local_28,0);
    if (local_28 != (long *)0x0) {
      (**(code **)(*local_28 + 8))();
    }
    if ((this->_thread)._M_id._M_thread != 0) {
      std::terminate();
    }
    (this->_thread)._M_id._M_thread = (native_handle_type)local_20._M_id._M_thread;
  }
  return SUB41(iVar1,0);
}

Assistant:

bool ProtocolReader::start()
{
    if (_stream->start())
    {
        _is_running = true;
        _thread = std::thread([this] { _read_events(); });
        return true;
    }

    return false;
}